

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudioVoice_SetOutputFilterParameters
                   (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
                   FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  FAudioSendDescriptor *pFVar1;
  uint uVar2;
  ulong uVar3;
  FAudioVoice **ppFVar4;
  
  if ((OperationSet != 0) && (voice->audio->active != '\0')) {
    FAudio_OPERATIONSET_QueueSetOutputFilterParameters
              (voice,pDestinationVoice,pParameters,OperationSet);
    return 0;
  }
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return 0;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar2 = (voice->sends).SendCount;
  if (uVar2 == 1 && pDestinationVoice == (FAudioVoice *)0x0) {
    pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
    uVar2 = 1;
  }
  else if (uVar2 == 0) goto LAB_00115ba2;
  pFVar1 = (voice->sends).pSends;
  ppFVar4 = &pFVar1->pOutputVoice;
  uVar3 = 0;
  do {
    if (pDestinationVoice == *ppFVar4) {
      if ((pFVar1[uVar3 & 0xffffffff].Flags & 0x80) != 0) {
        SDL_memcpy(voice->sendFilter + (uVar3 & 0xffffffff),pParameters,0xc);
      }
      FAudio_PlatformUnlockMutex(voice->sendLock);
      return 0;
    }
    uVar3 = uVar3 + 1;
    ppFVar4 = (FAudioVoice **)((long)ppFVar4 + 0xc);
  } while (uVar2 != uVar3);
LAB_00115ba2:
  FAudio_PlatformUnlockMutex(voice->sendLock);
  return 0x88960001;
}

Assistant:

uint32_t FAudioVoice_SetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	uint32_t i;
	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetOutputFilterParameters(
			voice,
			pDestinationVoice,
			pParameters,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		&voice->sendFilter[i],
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}